

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actorptrselect.cpp
# Opt level: O1

void VerifyTargetChain(AActor *self,bool preciseMissileCheck)

{
  TObjPtr<AActor> *pTVar1;
  AActor *pAVar2;
  byte bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AActor *pAVar5;
  AActor *pAVar6;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar7;
  AActor *pAVar8;
  AActor *pAVar9;
  bool bVar10;
  
  if (self != (AActor *)0x0) {
    bVar3 = *(byte *)((long)&(self->flags).Value + 2);
    if ((bVar3 & 1) == 0 && preciseMissileCheck) {
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      bVar3 = ((self->super_DThinker).super_DObject.Class)->Defaults[0x1be] & 1;
    }
    if ((bVar3 & 1) != 0) {
      pTVar1 = &self->target;
      pAVar9 = (self->target).field_0.p;
      pAVar8 = self;
      if ((pAVar9 != (AActor *)0x0) &&
         (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (pTVar1->field_0).p = (AActor *)0x0;
        pAVar9 = (AActor *)0x0;
      }
      do {
        if (pAVar9 == (AActor *)0x0) {
          return;
        }
        bVar3 = *(byte *)((long)&(pAVar9->flags).Value + 2);
        if ((bVar3 & 1) == 0 && preciseMissileCheck) {
          if ((pAVar9->super_DThinker).super_DObject.Class == (PClass *)0x0) {
            iVar4 = (**(pAVar9->super_DThinker).super_DObject._vptr_DObject)(pAVar9);
            (pAVar9->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar4)
            ;
          }
          bVar3 = ((pAVar9->super_DThinker).super_DObject.Class)->Defaults[0x1be] & 1;
        }
        if ((bVar3 & 1) == 0) {
          return;
        }
        bVar10 = pAVar9 == self;
        paVar7 = &pTVar1->field_0;
        pAVar6 = pAVar9;
        if (bVar10) {
LAB_00343592:
          paVar7->p = (AActor *)0x0;
        }
        else {
          pAVar5 = self;
          if (pAVar8 != self) {
            do {
              pAVar2 = (pAVar5->target).field_0.p;
              if ((pAVar2 != (AActor *)0x0) &&
                 (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                (pAVar5->target).field_0.p = (AActor *)0x0;
                pAVar2 = (AActor *)0x0;
              }
              pAVar5 = pAVar2;
              bVar10 = pAVar5 == pAVar9;
              if (bVar10) goto LAB_00343592;
            } while (pAVar5 != pAVar8);
          }
          pAVar6 = (pAVar9->target).field_0.p;
          pAVar8 = pAVar9;
          if ((pAVar6 != (AActor *)0x0) &&
             (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            paVar7 = &(pAVar9->target).field_0;
            pAVar6 = (AActor *)0x0;
            goto LAB_00343592;
          }
        }
        pAVar9 = pAVar6;
      } while (!bVar10);
    }
  }
  return;
}

Assistant:

void VerifyTargetChain(AActor *self, bool preciseMissileCheck)
{
	if (!self || !self->isMissile(preciseMissileCheck)) return;

	AActor *origin = self;
	AActor *next = origin->target;

	// origin: the most recent actor that has been verified as appearing only once
	// next: the next actor to be verified; will be "origin" in the next iteration

	while (next && next->isMissile(preciseMissileCheck)) // we only care when there are missiles involved
	{
		AActor *compare = self;
		// every new actor must prove not to be the first actor in the chain, or any subsequent actor
		// any actor up to and including "origin" has only appeared once
		for (;;)
 		{
			if (compare == next)
			{
				// if any of the actors from self to (inclusive) origin match the next actor,
				// self has reached/created a loop
				self->target = NULL;
				return;
			}
			if (compare == origin) break; // when "compare" = origin, we know that the next actor is, and should be "next"
			compare = compare->target;
		}

		origin = next;
		next = next->target;
	}
}